

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationBuilder::closeOverComposites(CollationBuilder *this,UErrorCode *errorCode)

{
  Normalizer2 *pNVar1;
  UBool UVar2;
  uint uVar3;
  int32_t iVar4;
  UnicodeString *str;
  UnicodeString *composite;
  UnicodeSetIterator iter;
  UnicodeString nfdString;
  UnicodeString prefix;
  ConstChar16Ptr local_b8;
  UnicodeString local_b0;
  undefined1 local_70 [8];
  UnicodeSet composites;
  UErrorCode *errorCode_local;
  CollationBuilder *this_local;
  
  composites._80_8_ = errorCode;
  ConstChar16Ptr::ConstChar16Ptr(&local_b8,L"[:NFD_QC=N:]");
  UnicodeString::UnicodeString(&local_b0,'\x01',&local_b8,-1);
  UnicodeSet::UnicodeSet((UnicodeSet *)local_70,&local_b0,(UErrorCode *)composites._80_8_);
  UnicodeString::~UnicodeString(&local_b0);
  ConstChar16Ptr::~ConstChar16Ptr(&local_b8);
  UVar2 = ::U_FAILURE(*(UErrorCode *)composites._80_8_);
  if (UVar2 == '\0') {
    UnicodeSet::remove((UnicodeSet *)local_70,(char *)0xac00);
    UnicodeString::UnicodeString((UnicodeString *)((long)&nfdString.fUnion + 0x30));
    UnicodeString::UnicodeString((UnicodeString *)&iter.cpString);
    UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)&composite,(UnicodeSet *)local_70);
    while (UVar2 = UnicodeSetIterator::next((UnicodeSetIterator *)&composite), UVar2 != '\0') {
      pNVar1 = this->nfd;
      uVar3 = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)&composite);
      (*(pNVar1->super_UObject)._vptr_UObject[7])(pNVar1,(ulong)uVar3,&iter.cpString);
      iVar4 = CollationDataBuilder::getCEs
                        (this->dataBuilder,(UnicodeString *)&iter.cpString,this->ces,0);
      this->cesLength = iVar4;
      if (this->cesLength < 0x20) {
        str = UnicodeSetIterator::getString((UnicodeSetIterator *)&composite);
        addIfDifferent(this,(UnicodeString *)((long)&nfdString.fUnion + 0x30),str,this->ces,
                       this->cesLength,0xffffffff,(UErrorCode *)composites._80_8_);
      }
    }
    UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)&composite);
    UnicodeString::~UnicodeString((UnicodeString *)&iter.cpString);
    UnicodeString::~UnicodeString((UnicodeString *)((long)&nfdString.fUnion + 0x30));
  }
  UnicodeSet::~UnicodeSet((UnicodeSet *)local_70);
  return;
}

Assistant:

void
CollationBuilder::closeOverComposites(UErrorCode &errorCode) {
    UnicodeSet composites(UNICODE_STRING_SIMPLE("[:NFD_QC=N:]"), errorCode);  // Java: static final
    if(U_FAILURE(errorCode)) { return; }
    // Hangul is decomposed on the fly during collation.
    composites.remove(Hangul::HANGUL_BASE, Hangul::HANGUL_END);
    UnicodeString prefix;  // empty
    UnicodeString nfdString;
    UnicodeSetIterator iter(composites);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        nfd.getDecomposition(iter.getCodepoint(), nfdString);
        cesLength = dataBuilder->getCEs(nfdString, ces, 0);
        if(cesLength > Collation::MAX_EXPANSION_LENGTH) {
            // Too many CEs from the decomposition (unusual), ignore this composite.
            // We could add a capacity parameter to getCEs() and reallocate if necessary.
            // However, this can only really happen in contrived cases.
            continue;
        }
        const UnicodeString &composite(iter.getString());
        addIfDifferent(prefix, composite, ces, cesLength, Collation::UNASSIGNED_CE32, errorCode);
    }
}